

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O2

TransactionException *
duckdb::ErrorManager::InvalidatedTransaction
          (TransactionException *__return_storage_ptr__,ClientContext *context)

{
  string local_30;
  
  FormatException<>(&local_30,context,INVALIDATED_TRANSACTION);
  TransactionException::TransactionException(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

TransactionException ErrorManager::InvalidatedTransaction(ClientContext &context) {
	return TransactionException(ErrorManager::FormatException(context, ErrorType::INVALIDATED_TRANSACTION));
}